

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O2

type unodb::qsbr_state::inc_epoch_reset_previous(type word)

{
  qsbr_epoch qVar1;
  bool bVar2;
  qsbr_thread_count_type qVar3;
  qsbr_thread_count_type qVar4;
  undefined8 in_RAX;
  type tVar5;
  ulong word_00;
  undefined8 uStack_38;
  qsbr_epoch old_epoch;
  
  uStack_38 = in_RAX;
  assert_invariants(word);
  qVar3 = get_threads_in_previous_epoch(word);
  if (qVar3 != 0) {
    __assert_fail("get_threads_in_previous_epoch(word) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x157,"static type unodb::qsbr_state::inc_epoch_reset_previous(type)");
  }
  qVar1 = get_epoch(word);
  uStack_38._0_7_ = CONCAT16(qVar1.epoch_val,(undefined6)uStack_38);
  qVar1 = detail::qsbr_epoch::advance((qsbr_epoch *)((long)&uStack_38 + 6),1);
  tVar5 = make_from_epoch(qVar1);
  word_00 = (ulong)((uint)(word >> 0x20) & 0x3fffffff) | word & 0x3fffffff00000000 | tVar5;
  qVar1 = get_epoch(word_00);
  uStack_38 = CONCAT17(qVar1.epoch_val,(undefined7)uStack_38);
  qVar1 = detail::qsbr_epoch::advance((qsbr_epoch *)((long)&uStack_38 + 6),1);
  bVar2 = detail::qsbr_epoch::operator==((qsbr_epoch *)((long)&uStack_38 + 7),qVar1);
  if (!bVar2) {
    __assert_fail("get_epoch(result) == old_epoch.advance()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x161,"static type unodb::qsbr_state::inc_epoch_reset_previous(type)");
  }
  qVar3 = get_thread_count(word_00);
  qVar4 = get_thread_count(word);
  if (qVar3 != qVar4) {
    __assert_fail("get_thread_count(result) == get_thread_count(word)",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x162,"static type unodb::qsbr_state::inc_epoch_reset_previous(type)");
  }
  qVar4 = get_threads_in_previous_epoch(word_00);
  if (qVar4 == qVar3) {
    assert_invariants(word_00);
    return word_00;
  }
  __assert_fail("get_threads_in_previous_epoch(result) == get_thread_count(result)",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                ,0x164,"static type unodb::qsbr_state::inc_epoch_reset_previous(type)");
}

Assistant:

[[nodiscard, gnu::const]] static constexpr type inc_epoch_reset_previous(
      type word) noexcept {
    assert_invariants(word);
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(word) == 0);

    const auto old_epoch = get_epoch(word);
    const auto new_epoch_in_word = make_from_epoch(old_epoch.advance());
    const auto new_thread_count_in_word = word & thread_count_in_word_mask;
    const auto new_threads_in_previous = (word >> thread_count_in_word_offset) &
                                         threads_in_previous_epoch_in_word_mask;
    const auto result =
        new_epoch_in_word | new_thread_count_in_word | new_threads_in_previous;

    UNODB_DETAIL_ASSERT(get_epoch(result) == old_epoch.advance());
    UNODB_DETAIL_ASSERT(get_thread_count(result) == get_thread_count(word));
    UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(result) ==
                        get_thread_count(result));
    assert_invariants(result);

    return result;
  }